

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateSourceForMessage
          (FileGenerator *this,int idx,Printer *printer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Options *options;
  size_type __dnew;
  NamespaceOpener ns;
  Formatter format;
  CrossFileReferences refs;
  string local_158;
  size_type local_138;
  NamespaceOpener local_130;
  Formatter local_110;
  CrossFileReferences local_d8;
  
  local_110.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_110.vars_._M_t,&(this->variables_)._M_t);
  GenerateSourceIncludes(this,printer);
  local_d8.weak_default_instances._M_h._M_buckets =
       &local_d8.weak_default_instances._M_h._M_single_bucket;
  options = (Options *)0x1;
  local_d8.weak_default_instances._M_h._M_bucket_count = 1;
  local_d8.weak_default_instances._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d8.weak_default_instances._M_h._M_element_count = 0;
  local_d8.weak_default_instances._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_d8.weak_default_instances._M_h._M_rehash_policy._M_next_resize = 0;
  local_d8.weak_default_instances._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_d8.strong_reflection_files._M_h._M_buckets =
       &local_d8.strong_reflection_files._M_h._M_single_bucket;
  local_d8.strong_reflection_files._M_h._M_bucket_count = 1;
  local_d8.strong_reflection_files._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d8.strong_reflection_files._M_h._M_element_count = 0;
  local_d8.strong_reflection_files._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_d8.strong_reflection_files._M_h._M_rehash_policy._M_next_resize = 0;
  local_d8.strong_reflection_files._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_d8.weak_reflection_files._M_h._M_buckets =
       &local_d8.weak_reflection_files._M_h._M_single_bucket;
  local_d8.weak_reflection_files._M_h._M_bucket_count = 1;
  local_d8.weak_reflection_files._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d8.weak_reflection_files._M_h._M_element_count = 0;
  local_d8.weak_reflection_files._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_d8.weak_reflection_files._M_h._M_rehash_policy._M_next_resize = 0;
  local_d8.weak_reflection_files._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_130.name_stack_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_d8;
  local_130.printer_ = (Printer *)this;
  ForEachField<google::protobuf::compiler::cpp::FileGenerator::GenerateSourceForMessage(int,google::protobuf::io::Printer*)::__0>
            (*(Descriptor **)
              (this->message_generators_).
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[idx]._M_t.
              super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
              ._M_t,(anon_class_16_2_3fe543fb *)&local_130);
  GenerateInternalForwardDeclarations(this,&local_d8,printer);
  Namespace_abi_cxx11_(&local_158,(cpp *)this->file_,(FileDescriptor *)&this->options_,options);
  NamespaceOpener::NamespaceOpener(&local_130,&local_158,&local_110);
  paVar1 = &local_158.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  GenerateSourceDefaultInstance(this,idx,printer);
  Formatter::operator()<>(&local_110,"\n");
  MessageGenerator::GenerateClassMethods
            ((MessageGenerator *)
             (this->message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[idx]._M_t.
             super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
             ._M_t,printer);
  Formatter::operator()<>(&local_110,"\n// @@protoc_insertion_point(namespace_scope)\n");
  NamespaceOpener::~NamespaceOpener(&local_130);
  local_138 = 0x15;
  local_158._M_dataplus._M_p = (pointer)paVar1;
  local_158._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_158,(ulong)&local_138);
  local_158.field_2._M_allocated_capacity = local_138;
  builtin_strncpy(local_158._M_dataplus._M_p,"PROTOBUF_NAMESPACE_ID",0x15);
  local_158._M_string_length = local_138;
  local_158._M_dataplus._M_p[local_138] = '\0';
  NamespaceOpener::NamespaceOpener(&local_130,&local_158,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  MessageGenerator::GenerateSourceInProto2Namespace
            ((MessageGenerator *)
             (this->message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[idx]._M_t.
             super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
             ._M_t,printer);
  NamespaceOpener::~NamespaceOpener(&local_130);
  Formatter::operator()<>(&local_110,"\n// @@protoc_insertion_point(global_scope)\n");
  std::
  _Hashtable<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_d8.weak_reflection_files._M_h);
  std::
  _Hashtable<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_d8.strong_reflection_files._M_h);
  std::
  _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_d8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_110.vars_._M_t);
  return;
}

Assistant:

void FileGenerator::GenerateSourceForMessage(int idx, io::Printer* printer) {
  Formatter format(printer, variables_);
  GenerateSourceIncludes(printer);

  CrossFileReferences refs;
  ForEachField(message_generators_[idx]->descriptor_,
               [this, &refs](const FieldDescriptor* field) {
                 GetCrossFileReferencesForField(field, &refs);
               });
  GenerateInternalForwardDeclarations(refs, printer);

  {  // package namespace
    NamespaceOpener ns(Namespace(file_, options_), format);

    // Define default instances
    GenerateSourceDefaultInstance(idx, printer);

    // Generate classes.
    format("\n");
    message_generators_[idx]->GenerateClassMethods(printer);

    format(
        "\n"
        "// @@protoc_insertion_point(namespace_scope)\n");
  }  // end package namespace

  {
    NamespaceOpener proto_ns(ProtobufNamespace(options_), format);
    message_generators_[idx]->GenerateSourceInProto2Namespace(printer);
  }

  format(
      "\n"
      "// @@protoc_insertion_point(global_scope)\n");
}